

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orthographic_camera_estimation_linear.hpp
# Opt level: O3

ScaledOrthoProjectionParameters *
eos::fitting::estimate_orthographic_projection_linear
          (ScaledOrthoProjectionParameters *__return_storage_ptr__,
          vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
          *image_points,
          vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
          *model_points,bool is_viewport_upsidedown,optional<int> viewport_height)

{
  pointer pMVar1;
  pointer pMVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  ScaledOrthoProjectionParameters *pSVar8;
  iterator __begin3;
  pointer pMVar9;
  float *pfVar10;
  MatrixUType *pMVar11;
  MatrixVType *pMVar12;
  undefined8 *puVar13;
  runtime_error *this;
  long lVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar23 [16];
  float fVar25;
  undefined1 auVar24 [16];
  float fVar26;
  Matrix3f R_ortho;
  Matrix<float,__1,_8,_0,__1,_8> A;
  DstEvaluatorType dstEvaluator_1;
  Matrix<float,_8,_1,_0,_8,_1> k;
  Matrix3f U;
  SrcEvaluatorType srcEvaluator;
  type tmp;
  DstEvaluatorType dstEvaluator;
  JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> svd;
  Matrix3f V;
  Matrix3f R;
  assign_op<float,_float> local_2e9;
  Matrix<float,__1,_1,_0,__1,_1> local_2e8;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  assign_op<float,_float> *local_2c8;
  undefined8 uStack_2c0;
  float local_2b8;
  void *local_2a8;
  ulong local_2a0;
  undefined8 local_298;
  float fStack_290;
  float fStack_28c;
  ScaledOrthoProjectionParameters *local_288;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
  *local_280;
  Matrix<float,_8,_1,_0,_8,_1> local_278;
  Matrix<float,_3,_3,_0,_3,_3> local_258;
  SrcEvaluatorType local_230;
  undefined1 local_208 [16];
  undefined8 local_1f8;
  ulong uStack_1f0;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
  local_1e8;
  float local_1c8;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
  local_1b8;
  JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> local_198;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58;
  MatrixType local_54;
  undefined1 auVar18 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  pMVar9 = (image_points->
           super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pMVar1 = (image_points->
           super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar15 = (long)pMVar1 - (long)pMVar9 >> 3;
  if (uVar15 != (long)(model_points->
                      super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(model_points->
                      super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 4) {
    __assert_fail("image_points.size() == model_points.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/orthographic_camera_estimation_linear.hpp"
                  ,0x4d,
                  "ScaledOrthoProjectionParameters eos::fitting::estimate_orthographic_projection_linear(std::vector<Eigen::Vector2f>, std::vector<Eigen::Vector4f>, bool, cpp17::optional<int>)"
                 );
  }
  if (uVar15 < 4) {
    __assert_fail("image_points.size() >= 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/orthographic_camera_estimation_linear.hpp"
                  ,0x4e,
                  "ScaledOrthoProjectionParameters eos::fitting::estimate_orthographic_projection_linear(std::vector<Eigen::Vector2f>, std::vector<Eigen::Vector4f>, bool, cpp17::optional<int>)"
                 );
  }
  if (is_viewport_upsidedown) {
    if (((ulong)viewport_height.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int> >> 0x20 & 1) == 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this,
                 "Error: If is_viewport_upsidedown is set to true, viewport_height needs to be given."
                );
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (pMVar9 != pMVar1) {
      do {
        (pMVar9->super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
        [1] = (float)viewport_height.super__Optional_base<int,_true,_true>._M_payload.
                     super__Optional_payload_base<int>._M_payload -
              (pMVar9->super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>).m_storage.m_data
              .array[1];
        pMVar9 = pMVar9 + 1;
      } while (pMVar9 != pMVar1);
    }
  }
  uVar5 = (uint)uVar15;
  uVar6 = uVar5 * 2;
  local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_matrixU.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._0_8_ =
       SEXT48((int)uVar6);
  local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_matrixU.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  local_288 = __return_storage_ptr__;
  local_298 = image_points;
  if ((int)uVar5 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, -1, 8>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = Eigen::Matrix<float, -1, 8>]"
                 );
  }
  Eigen::PlainObjectBase<Eigen::Matrix<float,-1,8,0,-1,8>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,8,0,_1,8>>>
            ((PlainObjectBase<Eigen::Matrix<float,_1,8,0,_1,8>> *)&local_2a8,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_8,_0,__1,_8>_>_>
              *)&local_198);
  pMVar2 = (model_points->
           super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar14 = (long)(model_points->
                 super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar2;
  if (lVar14 != 0) {
    lVar14 = lVar14 >> 4;
    lVar14 = lVar14 + (ulong)(lVar14 == 0);
    uVar15 = 1;
    do {
      if ((long)local_2a0 <= (long)(uVar15 - 1)) {
LAB_0010bc6e:
        __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                      ,0x85,
                      "Eigen::Block<Eigen::Matrix<float, -1, 8>, 1, 4>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<float, -1, 8>, BlockRows = 1, BlockCols = 4, InnerPanel = false]"
                     );
      }
      *(undefined4 *)((long)local_2a8 + uVar15 * 4 + -4) =
           *(undefined4 *)
            ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.
                    m_data + uVar15 * 8 + -8);
      *(undefined4 *)((long)local_2a8 + uVar15 * 4 + local_2a0 * 4 + -4) =
           *(undefined4 *)
            ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.
                    m_data + uVar15 * 8 + -4);
      *(undefined4 *)((long)local_2a8 + uVar15 * 4 + local_2a0 * 8 + -4) =
           *(undefined4 *)
            ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.
                    m_data + uVar15 * 8);
      *(undefined4 *)((long)local_2a8 + uVar15 * 4 + local_2a0 * 0xc + -4) =
           *(undefined4 *)
            ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.
                    m_data + uVar15 * 8 + 4);
      if (local_2a0 <= uVar15) goto LAB_0010bc6e;
      *(undefined4 *)((long)local_2a8 + uVar15 * 4 + local_2a0 * 0x10) =
           *(undefined4 *)
            ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.
                    m_data + uVar15 * 8 + -8);
      *(undefined4 *)((long)local_2a8 + uVar15 * 4 + local_2a0 * 0x14) =
           *(undefined4 *)
            ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.
                    m_data + uVar15 * 8 + -4);
      *(undefined4 *)((long)local_2a8 + uVar15 * 4 + local_2a0 * 0x18) =
           *(undefined4 *)
            ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.
                    m_data + uVar15 * 8);
      *(undefined4 *)((long)local_2a8 + uVar15 * 4 + local_2a0 * 0x1c) =
           *(undefined4 *)
            ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.
                    m_data + uVar15 * 8 + 4);
      uVar15 = uVar15 + 2;
      lVar14 = lVar14 + -1;
    } while (lVar14 != 0);
  }
  local_2e8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (float *)0x0;
  uVar15 = (ulong)uVar6;
  pfVar10 = local_2e8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data
  ;
  if (uVar5 != 0) {
    pfVar10 = (float *)malloc(uVar15 * 4);
    if ((3 < uVar6) && (((ulong)pfVar10 & 0xf) != 0)) {
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/util/Memory.h"
                    ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (pfVar10 == (float *)0x0) {
      puVar13 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar13 = boost::program_options::detail::cmdline::cmdline;
      __cxa_throw(puVar13,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  local_2e8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data = pfVar10
  ;
  pMVar9 = (local_298->
           super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar14 = (long)(local_298->
                 super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar9;
  local_2e8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows = uVar15;
  if (lVar14 != 0) {
    lVar14 = lVar14 >> 3;
    uVar15 = 0;
    do {
      if ((uVar5 & 0x7fffffff) == uVar15) {
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                      ,0x93,
                      "Eigen::Block<Eigen::Matrix<float, -1, 1>, 2, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<float, -1, 1>, BlockRows = 2, BlockCols = 1, InnerPanel = false]"
                     );
      }
      local_2e8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [uVar15 * 2] = pMVar9[uVar15].super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                     m_storage.m_data.array[0];
      local_2e8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [uVar15 * 2 + 1] =
           *(float *)((long)&pMVar9[uVar15].
                             super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
                             m_data + 4);
      uVar15 = uVar15 + 1;
    } while (lVar14 + (ulong)(lVar14 == 0) != uVar15);
  }
  Eigen::ColPivHouseholderQR<Eigen::Matrix<float,-1,8,0,-1,8>>::
  ColPivHouseholderQR<Eigen::Matrix<float,_1,8,0,_1,8>>
            ((ColPivHouseholderQR<Eigen::Matrix<float,_1,8,0,_1,8>> *)&local_198,
             (EigenBase<Eigen::Matrix<float,__1,_8,_0,__1,_8>_> *)&local_2a8);
  Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,-1,8,0,-1,8>>>::
  _check_solve_assertion<false,Eigen::MatrixBase<Eigen::Matrix<float,_1,1,0,_1,1>>>
            ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,_1,8,0,_1,8>>> *)&local_198,
             (MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&local_2e8);
  Eigen::ColPivHouseholderQR<Eigen::Matrix<float,-1,8,0,-1,8>>::
  _solve_impl<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Matrix<float,8,1,0,8,1>>
            ((ColPivHouseholderQR<Eigen::Matrix<float,_1,8,0,_1,8>> *)&local_198,&local_2e8,
             &local_278);
  free((void *)local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.
               m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array._0_8_);
  auVar23._8_8_ = 0;
  auVar23._0_4_ =
       local_278.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [1];
  auVar23._4_4_ =
       local_278.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [2];
  auVar24._8_8_ = 0;
  auVar24._0_4_ =
       local_278.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [5];
  auVar24._4_4_ =
       local_278.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [6];
  fVar26 = local_278.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.
           array[2];
  fVar25 = local_278.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.
           array[6];
  local_298._0_4_ =
       fVar26 * fVar26 +
       local_278.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [1] * local_278.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.
             array[1] +
       local_278.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [0] * local_278.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.
             array[0];
  local_298._4_4_ =
       fVar25 * fVar25 +
       local_278.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [5] * local_278.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.
             array[5] +
       local_278.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [4] * local_278.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.
             array[4];
  fStack_290 = fVar26 * fVar26 + fVar26 * fVar26 + 0.0;
  fStack_28c = fVar26 * fVar26 + fVar25 * fVar25 + 0.0;
  if (0.0 < (float)local_298) {
    fVar26 = SQRT((float)local_298);
    local_278.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[0]
         = local_278.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.
           array[0] / fVar26;
    auVar4._4_4_ = fVar26;
    auVar4._0_4_ = fVar26;
    auVar4._8_4_ = fVar26;
    auVar4._12_4_ = fVar26;
    auVar23 = divps(auVar23,auVar4);
    local_278.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.array.
    _4_8_ = auVar23._0_8_;
  }
  local_54.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       local_278.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [4];
  uVar15 = local_278.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.
           array._20_8_;
  if (0.0 < local_298._4_4_) {
    fVar26 = SQRT(local_298._4_4_);
    local_54.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
         local_278.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.
         array[4] / fVar26;
    auVar3._4_4_ = fVar26;
    auVar3._0_4_ = fVar26;
    auVar3._8_4_ = fVar26;
    auVar3._12_4_ = fVar26;
    auVar23 = divps(auVar24,auVar3);
    uVar15 = auVar23._0_8_;
  }
  local_1f8 = CONCAT44(local_278.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.
                       m_storage.m_data.array[4],
                       local_278.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.
                       m_storage.m_data.array[3]);
  uStack_1f0._0_4_ =
       local_278.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [5];
  uStack_1f0._4_4_ =
       local_278.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [6];
  local_208 = ZEXT416((uint)local_278.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.
                            m_storage.m_data.array[7]);
  local_54.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       (float)local_278.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data
              .array._4_8_;
  local_54.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       (float)((ulong)local_278.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.
                      m_storage.m_data.array._4_8_ >> 0x20);
  local_54.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       (float)uVar15;
  local_54.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       (float)(uVar15 >> 0x20);
  local_54.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       local_54.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3] * local_54.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[7] -
       local_54.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4] * local_54.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[6];
  local_54.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       local_54.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * local_54.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[1] -
       local_54.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * local_278.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.
             array[0];
  local_54.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       local_278.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [0] * local_54.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[4] -
       local_54.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1] * local_54.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[3];
  local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.
  m_computationOptions = 0;
  local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_info =
       Success;
  local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_isInitialized
       = false;
  local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_isAllocated =
       false;
  local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.
  m_usePrescribedThreshold = false;
  local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_computeFullU
       = false;
  local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_computeThinU
       = false;
  local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_computeFullV
       = false;
  local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_computeThinV
       = false;
  local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_rows._0_4_ =
       0xffffffff;
  local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_rows._4_4_ =
       0xffffffff;
  local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_cols._0_4_ =
       0xffffffff;
  local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_cols._4_4_ =
       0xffffffff;
  local_198.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_diagSize = 0;
  local_54.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       local_278.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [0];
  Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::compute(&local_198,&local_54,0x14);
  pMVar11 = Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>::matrixU
                      (&local_198.
                        super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>);
  local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       (pMVar11->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [8];
  local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._0_8_
       = *(undefined8 *)
          (pMVar11->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array;
  local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._8_8_
       = *(undefined8 *)
          ((pMVar11->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array + 2);
  local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array.
  _16_8_ = *(undefined8 *)
            ((pMVar11->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
             .array + 4);
  local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array.
  _24_8_ = *(undefined8 *)
            ((pMVar11->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
             .array + 6);
  pMVar12 = Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>::matrixV
                      (&local_198.
                        super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>);
  local_78 = *(undefined8 *)
              (pMVar12->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.
              m_data.array;
  uStack_70 = *(undefined8 *)
               ((pMVar12->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.
                m_data.array + 2);
  local_68 = *(undefined8 *)
              ((pMVar12->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array + 4);
  uStack_60 = *(undefined8 *)
               ((pMVar12->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.
                m_data.array + 6);
  local_58 = (pMVar12->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
             .array[8];
  local_230.
  super_product_evaluator<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_innerDim = 3;
  local_1e8.m_dstExpr = (DstXprType *)&local_2d8;
  local_1e8.m_dst = (DstEvaluatorType *)&local_1b8;
  local_230.
  super_product_evaluator<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_lhs = &local_258;
  local_230.
  super_product_evaluator<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_rhs.m_matrix = (non_const_type)&local_78;
  local_230.
  super_product_evaluator<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_lhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>.m_d.data
       = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>)
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>)&local_258;
  local_230.
  super_product_evaluator<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_rhsImpl.
  super_unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_float>
  .m_argImpl.super_evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>.m_d.data =
       (unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_float>
        )(unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_float>
          )&local_78;
  local_1e8.m_src = &local_230;
  local_1e8.m_functor = (assign_op<float,_float> *)&local_280;
  local_1b8.m_dst = (DstEvaluatorType *)local_1e8.m_dstExpr;
  Eigen::internal::
  copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>,_0,_9>
  ::run(&local_1e8);
  fVar25 = (float)((ulong)local_2c8 >> 0x20);
  fVar26 = (float)local_2d8 * (local_2b8 * SUB84(local_2c8,0) - fVar25 * uStack_2c0._4_4_);
  auVar16._4_4_ = fVar26;
  auVar16._0_4_ = fVar26;
  auVar16._8_4_ = fVar26;
  auVar16._12_4_ = fVar26;
  auVar17._4_12_ = auVar16._4_12_;
  auVar17._0_4_ =
       (fVar26 - (local_2d8._4_4_ * local_2b8 + -uStack_2c0._4_4_ * (float)uStack_2d0) *
                 uStack_2d0._4_4_) +
       (float)uStack_2c0 * (local_2d8._4_4_ * fVar25 - (float)uStack_2d0 * SUB84(local_2c8,0));
  if (auVar17._0_4_ < 0.0) {
    local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array.
    _8_8_ = local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array._8_8_ ^ 0x80000000;
    local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array.
    _16_8_ = local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array._16_8_ ^ 0x8000000000000000;
    local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
         = -local_258.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[8];
    local_230.
    super_product_evaluator<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
    .m_innerDim = 3;
    local_1b8.m_functor = &local_2e9;
    local_280 = &local_1e8;
    local_230.
    super_product_evaluator<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
    .m_lhs = &local_258;
    local_230.
    super_product_evaluator<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
    .m_rhs.m_matrix = (non_const_type)&local_78;
    local_230.
    super_product_evaluator<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
    .m_lhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>.m_d.
    data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>)
           (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>)&local_258;
    local_230.
    super_product_evaluator<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
    .m_rhsImpl.
    super_unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_float>
    .m_argImpl.super_evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>.m_d.data =
         (unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_float>
          )(unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_float>
            )&local_78;
    local_1b8.m_dst = (DstEvaluatorType *)&local_280;
    local_1b8.m_src = &local_230;
    local_1b8.m_dstExpr = (DstXprType *)&local_1e8;
    Eigen::internal::
    copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>,_0,_9>
    ::run(&local_1b8);
    local_2d8 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
                 *)local_1e8.m_dst;
    uStack_2d0 = local_1e8.m_src;
    local_2c8 = local_1e8.m_functor;
    uStack_2c0 = (assign_op<float,_float> *)local_1e8.m_dstExpr;
    auVar17 = ZEXT416((uint)local_1c8);
    local_2b8 = local_1c8;
  }
  pSVar8 = local_288;
  auVar7._4_4_ = local_298._4_4_;
  auVar7._0_4_ = (float)local_298;
  auVar7._8_4_ = fStack_290;
  auVar7._12_4_ = fStack_28c;
  auVar23 = sqrtps(auVar17,auVar7);
  (local_288->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [8] = local_2b8;
  *(assign_op<float,_float> **)
   ((local_288->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array + 4) = local_2c8;
  *(assign_op<float,_float> **)
   ((local_288->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array + 6) = uStack_2c0;
  auVar19._4_4_ = auVar23._4_4_;
  fVar26 = (auVar19._4_4_ + auVar23._0_4_) * 0.5;
  *(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
    **)(local_288->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
       array = local_2d8;
  *(SrcEvaluatorType **)
   ((local_288->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array + 2) = uStack_2d0;
  auVar21._12_4_ = (undefined4)(uStack_1f0 >> 0x20);
  auVar21._8_4_ = (int)((ulong)local_1f8 >> 0x20);
  auVar21._0_8_ = local_1f8;
  auVar20._8_8_ = auVar21._8_8_;
  auVar20._0_4_ = (undefined4)local_1f8;
  auVar20._4_4_ = local_208._0_4_;
  auVar22._0_12_ = auVar20._0_12_;
  auVar22._12_4_ = local_208._4_4_;
  auVar19._0_4_ = fVar26;
  auVar19._8_4_ = auVar19._4_4_;
  auVar19._12_4_ = auVar19._4_4_;
  auVar18._8_8_ = auVar19._8_8_;
  auVar18._4_4_ = fVar26;
  auVar18._0_4_ = fVar26;
  auVar23 = divps(auVar22,auVar18);
  local_288->tx = (float)(int)auVar23._0_8_;
  local_288->ty = (float)(int)((ulong)auVar23._0_8_ >> 0x20);
  local_288->s = fVar26;
  free(local_2e8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_2a8);
  return pSVar8;
}

Assistant:

inline ScaledOrthoProjectionParameters estimate_orthographic_projection_linear(
    std::vector<Eigen::Vector2f> image_points, std::vector<Eigen::Vector4f> model_points,
    bool is_viewport_upsidedown, cpp17::optional<int> viewport_height = cpp17::nullopt)
{
    using Eigen::Matrix;
    assert(image_points.size() == model_points.size());
    assert(image_points.size() >= 4); // Number of correspondence points given needs to be equal to or larger than 4

    const int num_correspondences = static_cast<int>(image_points.size());

    if (is_viewport_upsidedown)
    {
        if (viewport_height == cpp17::nullopt)
        {
            throw std::runtime_error(
                "Error: If is_viewport_upsidedown is set to true, viewport_height needs to be given.");
        }
        for (auto&& ip : image_points)
        {
            ip[1] = viewport_height.value() - ip[1];
        }
    }

    Matrix<float, Eigen::Dynamic, 8> A = Matrix<float, Eigen::Dynamic, 8>::Zero(2 * num_correspondences, 8);
    for (int i = 0; i < model_points.size(); ++i)
    {
        A.block<1, 4>(2 * i, 0) = model_points[i];       // even row - copy to left side (first row is row 0)
        A.block<1, 4>((2 * i) + 1, 4) = model_points[i]; // odd row - copy to right side
    } // 4th coord (homogeneous) is already 1

    Matrix<float, Eigen::Dynamic, 1> b(2 * num_correspondences, 1);
    for (int i = 0; i < image_points.size(); ++i)
    {
        b.segment<2>(2 * i) = image_points[i];
    }

    // The original implementation used SVD here to solve the linear system, but
    // QR seems to do the job fine too.
    const Matrix<float, 8, 1> k = A.colPivHouseholderQr().solve(b); // resulting affine matrix (8x1)

    // Extract all values from the estimated affine parameters k:
    const Eigen::Vector3f R1 = k.segment<3>(0);
    const Eigen::Vector3f R2 = k.segment<3>(4);
    const float sTx = k(3);
    const float sTy = k(7);
    const auto s = (R1.norm() + R2.norm()) / 2.0f;
    Eigen::Matrix3f R;
    Eigen::Vector3f r1 = R1.normalized(); // Not sure why R1.normalize() (in-place) produces a compiler error.
    Eigen::Vector3f r2 = R2.normalized();
    R.block<1, 3>(0, 0) = r1;
    R.block<1, 3>(1, 0) = r2;
    R.block<1, 3>(2, 0) = r1.cross(r2);

    // Set R to the closest orthonormal matrix to the estimated affine transform:
    Eigen::JacobiSVD<Eigen::Matrix3f, Eigen::NoQRPreconditioner> svd(R, Eigen::ComputeFullU | Eigen::ComputeFullV);
    Eigen::Matrix3f U = svd.matrixU();
    const Eigen::Matrix3f V = svd.matrixV();
    Eigen::Matrix3f R_ortho = U * V.transpose();

    // The determinant of R must be 1 for it to be a valid rotation matrix
    if (R_ortho.determinant() < 0)
    {
        U.block<1, 3>(2, 0) = -U.block<1, 3>(2, 0); // not tested
        R_ortho = U * V.transpose();
    }

    // Remove the scale from the translations:
    const auto t1 = sTx / s;
    const auto t2 = sTy / s;

    return ScaledOrthoProjectionParameters{R_ortho, t1, t2, s};
}